

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

DistributionMapping __thiscall
amrex::DistributionMapping::makeSFC(DistributionMapping *this,MultiFab *weight,bool sort)

{
  int nprocs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  DistributionMapping DVar1;
  Vector<long,_std::allocator<long>_> cost;
  _Vector_base<long,_std::allocator<long>_> _Stack_38;
  
  anon_unknown_22::gather_weights((Vector<long,_std::allocator<long>_> *)&_Stack_38,weight);
  nprocs = *(int *)(DAT_006e0650 + -0x38);
  std::make_shared<amrex::DistributionMapping::Ref>();
  SFCProcessorMap(this,&(weight->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                  (vector<long,_std::allocator<long>_> *)&_Stack_38,nprocs,sort);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&_Stack_38);
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (DistributionMapping)
         DVar1.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const MultiFab& weight, bool sort)
{
    BL_PROFILE("makeSFC");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    DistributionMapping r;
    r.SFCProcessorMap(weight.boxArray(), cost, nprocs, sort);
    return r;
}